

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

bool __thiscall
cmComputeLinkInformation::AddLibraryFeature(cmComputeLinkInformation *this,string *feature)

{
  cmMakefile *pcVar1;
  cmake *pcVar2;
  pointer pBVar3;
  _Alloc_hider this_00;
  bool bVar4;
  iterator iVar5;
  cmValue list;
  long lVar6;
  string *psVar7;
  string *psVar8;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  items;
  undefined1 local_268 [16];
  string local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238 [3];
  _Alloc_hider local_208;
  undefined1 local_200 [16];
  undefined1 local_1f0 [72];
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  cmValue featureSupported;
  string featureName;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
          ::find(&(this->LibraryFeatureDescriptors)._M_t,feature);
  if ((_Rb_tree_header *)iVar5._M_node !=
      &(this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header) {
    return (bool)(char)iVar5._M_node[3]._M_color;
  }
  local_200._0_8_ = &DAT_00000006;
  local_200._8_8_ = (long)"The CMAKE_" + 4;
  local_238[0]._8_8_ = (this->LinkLanguage)._M_dataplus._M_p;
  local_238[0]._0_8_ = (this->LinkLanguage)._M_string_length;
  local_208._M_p = (pointer)&this->LibraryFeatureDescriptors;
  cmStrCat<char[21],std::__cxx11::string>
            (&featureName,(cmAlphaNum *)local_200,(cmAlphaNum *)local_238,(char (*) [21])0x66d29e,
             feature);
  pcVar1 = this->Makefile;
  local_200._0_8_ = featureName._M_string_length;
  local_200._8_8_ = featureName._M_dataplus._M_p;
  local_238[0]._M_allocated_capacity = 10;
  local_238[0]._8_8_ = (long)"CMAKE_CUDA_PIE_SUPPORTED" + 0xe;
  cmStrCat<>((string *)(local_268 + 0x10),(cmAlphaNum *)local_200,(cmAlphaNum *)local_238);
  featureSupported = cmMakefile::GetDefinition(pcVar1,(string *)(local_268 + 0x10));
  std::__cxx11::string::~string((string *)(local_268 + 0x10));
  if (featureSupported.Value == (string *)0x0) {
    local_200._0_8_ = (element_type *)0x19;
    local_200._8_8_ = "CMAKE_LINK_LIBRARY_USING_";
    local_238[0]._8_8_ = (feature->_M_dataplus)._M_p;
    local_238[0]._0_8_ = feature->_M_string_length;
    cmStrCat<>((string *)(local_268 + 0x10),(cmAlphaNum *)local_200,(cmAlphaNum *)local_238);
    std::__cxx11::string::operator=((string *)&featureName,(string *)(local_268 + 0x10));
    std::__cxx11::string::~string((string *)(local_268 + 0x10));
    pcVar1 = this->Makefile;
    local_200._0_8_ = featureName._M_string_length;
    local_200._8_8_ = featureName._M_dataplus._M_p;
    local_238[0]._M_allocated_capacity = 10;
    local_238[0]._8_8_ = (long)"CMAKE_CUDA_PIE_SUPPORTED" + 0xe;
    cmStrCat<>((string *)(local_268 + 0x10),(cmAlphaNum *)local_200,(cmAlphaNum *)local_238);
    featureSupported = cmMakefile::GetDefinition(pcVar1,(string *)(local_268 + 0x10));
    std::__cxx11::string::~string((string *)(local_268 + 0x10));
  }
  psVar8 = &this->LinkLanguage;
  bVar4 = cmValue::IsOn(&featureSupported);
  if (bVar4) {
    list = cmMakefile::GetDefinition(this->Makefile,&featureName);
    if (list.Value != (string *)0x0) {
      cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_200);
      cmExpandListWithBacktrace(&items,list.Value,(cmListFileBacktrace *)local_200,true);
      this_00._M_p = local_208._M_p;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_200 + 8));
      if (((long)items.
                 super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)items.
                 super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start != 0x30) ||
         (bVar4 = anon_unknown.dwarf_d8556d::IsValidFeatureFormat
                            (&(items.
                               super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->Value), bVar4)) {
        lVar6 = (long)items.
                      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)items.
                      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        if (lVar6 == 0x90) {
          bVar4 = anon_unknown.dwarf_d8556d::IsValidFeatureFormat
                            (&items.
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1].Value);
          if (!bVar4) goto LAB_002e46ac;
          lVar6 = (long)items.
                        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)items.
                        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
        }
        if (lVar6 / 0x30 == 3) {
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::insert(&items,items.
                          super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 1,
                   (value_type *)
                   (items.
                    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1));
          pBVar3 = items.
                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_200,"PATH{",(allocator<char> *)(local_268 + 0x10));
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_238[0]._M_local_buf,"NAME{",(allocator<char> *)local_268);
          anon_unknown.dwarf_d8556d::FinalizeFeatureFormat
                    (&pBVar3[1].Value,(string *)local_200,(string *)local_238);
          std::__cxx11::string::~string((string *)local_238[0]._M_local_buf);
          std::__cxx11::string::~string((string *)local_200);
          pBVar3 = items.
                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_200,"NAME{",(allocator<char> *)(local_268 + 0x10));
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_238[0]._M_local_buf,"PATH{",(allocator<char> *)local_268);
          anon_unknown.dwarf_d8556d::FinalizeFeatureFormat
                    (&pBVar3[2].Value,(string *)local_200,(string *)local_238);
        }
        else {
          if (lVar6 / 0x30 != 1) {
            memset((element_type *)local_1f0,0,0x98);
            local_200._8_8_ = (cmMakefile *)0x0;
            local_1f0[0x10] = '\0';
            local_1f0._24_8_ = local_1f0 + 0x28;
            local_1f0[0x28] = '\0';
            local_1f0._56_8_ = &local_1a8;
            local_1a8._0_1_ = 0;
            local_1a8._16_8_ = &local_188;
            local_188._M_local_buf[0] = false;
            local_178._M_allocated_capacity = (size_type)&local_168;
            local_168._M_local_buf[0] = '\0';
            local_200._0_8_ = (element_type *)local_1f0;
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
            ::
            _M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                        *)this_00._M_p,feature,(FeatureDescriptor *)local_200);
            FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)local_200);
            pcVar2 = this->CMakeInstance;
            local_200._0_8_ = &DAT_00000009;
            local_200._8_8_ = "Feature \'";
            local_238[0]._8_8_ = (feature->_M_dataplus)._M_p;
            local_238[0]._0_8_ = feature->_M_string_length;
            psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
            cmStrCat<char[27],std::__cxx11::string,char[79],std::__cxx11::string,char[3]>
                      ((string *)(local_268 + 0x10),(cmAlphaNum *)local_200,(cmAlphaNum *)local_238,
                       (char (*) [27])"\', specified by variable \'",&featureName,
                       (char (*) [79])
                       "\', is malformed (wrong number of elements) and cannot be used to link target \'"
                       ,psVar8,(char (*) [3])0x643a88);
            cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_268);
            cmake::IssueMessage(pcVar2,FATAL_ERROR,(string *)(local_268 + 0x10),
                                (cmListFileBacktrace *)local_268);
            goto LAB_002e4d77;
          }
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::push_back(&items,items.
                             super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          pBVar3 = items.
                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_200,"PATH{",(allocator<char> *)(local_268 + 0x10));
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_238[0]._M_local_buf,"NAME{",(allocator<char> *)local_268);
          anon_unknown.dwarf_d8556d::FinalizeFeatureFormat
                    (&pBVar3->Value,(string *)local_200,(string *)local_238);
          std::__cxx11::string::~string((string *)local_238[0]._M_local_buf);
          std::__cxx11::string::~string((string *)local_200);
          pBVar3 = items.
                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_200,"NAME{",(allocator<char> *)(local_268 + 0x10));
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_238[0]._M_local_buf,"PATH{",(allocator<char> *)local_268);
          anon_unknown.dwarf_d8556d::FinalizeFeatureFormat
                    (&pBVar3[1].Value,(string *)local_200,(string *)local_238);
        }
        std::__cxx11::string::~string((string *)local_238[0]._M_local_buf);
        std::__cxx11::string::~string((string *)local_200);
        if ((((long)items.
                    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)items.
                    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0x60) &&
            (bVar4 = anon_unknown.dwarf_d8556d::IsValidFeatureFormat
                               (&(items.
                                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->Value), !bVar4)) ||
           (((long)items.
                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)items.
                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start == 0xc0 &&
            (bVar4 = anon_unknown.dwarf_d8556d::IsValidFeatureFormat
                               (&items.
                                 super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[1].Value), !bVar4)))) {
          memset((element_type *)local_1f0,0,0x98);
          local_200._8_8_ = (cmMakefile *)0x0;
          local_1f0[0x10] = '\0';
          local_1f0._24_8_ = local_1f0 + 0x28;
          local_1f0[0x28] = '\0';
          local_1f0._56_8_ = &local_1a8;
          local_1a8._0_1_ = 0;
          local_1a8._16_8_ = &local_188;
          local_188._M_local_buf[0] = false;
          local_178._M_allocated_capacity = (size_type)&local_168;
          local_168._M_local_buf[0] = '\0';
          local_200._0_8_ = (element_type *)local_1f0;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
          ::
          _M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                      *)this_00._M_p,feature,(FeatureDescriptor *)local_200);
          FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)local_200);
          pcVar2 = this->CMakeInstance;
          local_200._0_8_ = &DAT_00000009;
          local_200._8_8_ = "Feature \'";
          local_238[0]._8_8_ = (feature->_M_dataplus)._M_p;
          local_238[0]._0_8_ = feature->_M_string_length;
          psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
          cmStrCat<char[27],std::__cxx11::string,char[144],std::__cxx11::string,char[3]>
                    ((string *)(local_268 + 0x10),(cmAlphaNum *)local_200,(cmAlphaNum *)local_238,
                     (char (*) [27])"\', specified by variable \'",&featureName,
                     (char (*) [144])
                     "\', is malformed (\"<LIBRARY>\", \"<LIB_ITEM>\", or \"<LINK_ITEM>\" patterns are missing for \"PATH{}\" alternative) and cannot be used to link target \'"
                     ,psVar8,(char (*) [3])0x643a88);
          cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_268);
          cmake::IssueMessage(pcVar2,FATAL_ERROR,(string *)(local_268 + 0x10),
                              (cmListFileBacktrace *)local_268);
          goto LAB_002e4d77;
        }
        if ((((long)items.
                    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)items.
                    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0x60) &&
            (bVar4 = anon_unknown.dwarf_d8556d::IsValidFeatureFormat
                               (&items.
                                 super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[1].Value), !bVar4)) ||
           (((long)items.
                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)items.
                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start == 0xc0 &&
            (bVar4 = anon_unknown.dwarf_d8556d::IsValidFeatureFormat
                               (&items.
                                 super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[2].Value), !bVar4)))) {
          memset((element_type *)local_1f0,0,0x98);
          local_200._8_8_ = (cmMakefile *)0x0;
          local_1f0[0x10] = '\0';
          local_1f0._24_8_ = local_1f0 + 0x28;
          local_1f0[0x28] = '\0';
          local_1f0._56_8_ = &local_1a8;
          local_1a8._0_1_ = 0;
          local_1a8._16_8_ = &local_188;
          local_188._M_local_buf[0] = false;
          local_178._M_allocated_capacity = (size_type)&local_168;
          local_168._M_local_buf[0] = '\0';
          local_200._0_8_ = (element_type *)local_1f0;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
          ::
          _M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                      *)this_00._M_p,feature,(FeatureDescriptor *)local_200);
          FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)local_200);
          pcVar2 = this->CMakeInstance;
          local_200._0_8_ = &DAT_00000009;
          local_200._8_8_ = "Feature \'";
          local_238[0]._8_8_ = (feature->_M_dataplus)._M_p;
          local_238[0]._0_8_ = feature->_M_string_length;
          psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
          cmStrCat<char[27],std::__cxx11::string,char[144],std::__cxx11::string,char[3]>
                    ((string *)(local_268 + 0x10),(cmAlphaNum *)local_200,(cmAlphaNum *)local_238,
                     (char (*) [27])"\', specified by variable \'",&featureName,
                     (char (*) [144])
                     "\', is malformed (\"<LIBRARY>\", \"<LIB_ITEM>\", or \"<LINK_ITEM>\" patterns are missing for \"NAME{}\" alternative) and cannot be used to link target \'"
                     ,psVar8,(char (*) [3])0x643a88);
          cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_268);
          cmake::IssueMessage(pcVar2,FATAL_ERROR,(string *)(local_268 + 0x10),
                              (cmListFileBacktrace *)local_268);
          goto LAB_002e4d77;
        }
        cmGeneratorTarget::ResolveLinkerWrapper(this->Target,&items,psVar8,true);
        if ((long)items.
                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)items.
                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x60) {
          std::__cxx11::string::string((string *)&local_50,(string *)feature);
          std::__cxx11::string::string
                    ((string *)&local_70,
                     (string *)
                     items.
                     super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
          std::__cxx11::string::string
                    ((string *)&local_90,
                     (string *)
                     (items.
                      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1));
          LibraryFeatureDescriptor::LibraryFeatureDescriptor
                    ((LibraryFeatureDescriptor *)local_200,&local_50,&local_70,&local_90);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
          ::
          _M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::LibraryFeatureDescriptor>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                      *)this_00._M_p,feature,(LibraryFeatureDescriptor *)local_200);
          FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)local_200);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_70);
          psVar8 = &local_50;
        }
        else {
          std::__cxx11::string::string((string *)&local_b0,(string *)feature);
          std::__cxx11::string::string
                    ((string *)&local_d0,
                     (string *)
                     items.
                     super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
          std::__cxx11::string::string
                    ((string *)&local_f0,
                     (string *)
                     (items.
                      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1));
          std::__cxx11::string::string
                    ((string *)&local_110,
                     (string *)
                     (items.
                      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 2));
          std::__cxx11::string::string
                    ((string *)&local_130,
                     (string *)
                     (items.
                      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 3));
          LibraryFeatureDescriptor::LibraryFeatureDescriptor
                    ((LibraryFeatureDescriptor *)local_200,&local_b0,&local_d0,&local_f0,&local_110,
                     &local_130);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
          ::
          _M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::LibraryFeatureDescriptor>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                      *)this_00._M_p,feature,(LibraryFeatureDescriptor *)local_200);
          FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)local_200);
          std::__cxx11::string::~string((string *)&local_130);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_d0);
          psVar8 = &local_b0;
        }
        std::__cxx11::string::~string((string *)psVar8);
        bVar4 = true;
      }
      else {
LAB_002e46ac:
        memset((element_type *)local_1f0,0,0x98);
        local_200._8_8_ = (cmMakefile *)0x0;
        local_1f0[0x10] = '\0';
        local_1f0._24_8_ = local_1f0 + 0x28;
        local_1f0[0x28] = '\0';
        local_1f0._56_8_ = &local_1a8;
        local_1a8._0_1_ = 0;
        local_1a8._16_8_ = &local_188;
        local_188._M_local_buf[0] = false;
        local_178._M_allocated_capacity = (size_type)&local_168;
        local_168._M_local_buf[0] = '\0';
        local_200._0_8_ = (element_type *)local_1f0;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
        ::_M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                    *)this_00._M_p,feature,(FeatureDescriptor *)local_200);
        FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)local_200);
        pcVar2 = this->CMakeInstance;
        local_200._0_8_ = &DAT_00000009;
        local_200._8_8_ = "Feature \'";
        local_238[0]._8_8_ = (feature->_M_dataplus)._M_p;
        local_238[0]._0_8_ = feature->_M_string_length;
        psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
        cmStrCat<char[27],std::__cxx11::string,char[119],std::__cxx11::string,char[3]>
                  ((string *)(local_268 + 0x10),(cmAlphaNum *)local_200,(cmAlphaNum *)local_238,
                   (char (*) [27])"\', specified by variable \'",&featureName,
                   (char (*) [119])
                   "\', is malformed (\"<LIBRARY>\", \"<LIB_ITEM>\", or \"<LINK_ITEM>\" patterns are missing) and cannot be used to link target \'"
                   ,psVar8,(char (*) [3])0x643a88);
        cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_268);
        cmake::IssueMessage(pcVar2,FATAL_ERROR,(string *)(local_268 + 0x10),
                            (cmListFileBacktrace *)local_268);
LAB_002e4d77:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_268 + 8));
        std::__cxx11::string::~string((string *)(local_268 + 0x10));
        bVar4 = false;
      }
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&items);
      goto LAB_002e4d97;
    }
    memset((element_type *)local_1f0,0,0x98);
    local_200._8_8_ = (cmMakefile *)0x0;
    local_1f0[0x10] = '\0';
    local_1f0._24_8_ = local_1f0 + 0x28;
    local_1f0[0x28] = '\0';
    local_1f0._56_8_ = &local_1a8;
    local_1a8._0_1_ = 0;
    local_1a8._16_8_ = &local_188;
    local_188._M_local_buf[0] = false;
    local_178._M_allocated_capacity = (size_type)&local_168;
    local_168._M_local_buf[0] = '\0';
    local_200._0_8_ = (element_type *)local_1f0;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
    ::_M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                *)local_208._M_p,feature,(FeatureDescriptor *)local_200);
    FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)local_200);
    pcVar2 = this->CMakeInstance;
    local_200._0_8_ = &DAT_00000009;
    local_200._8_8_ = "Feature \'";
    local_238[0]._8_8_ = (feature->_M_dataplus)._M_p;
    local_238[0]._0_8_ = feature->_M_string_length;
    psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    cmStrCat<char[77],std::__cxx11::string,char[28],std::__cxx11::string,char[17]>
              ((string *)(local_268 + 0x10),(cmAlphaNum *)local_200,(cmAlphaNum *)local_238,
               (char (*) [77])
               "\', specified through generator-expression \'$<LINK_LIBRARY>\' to link target \'",
               psVar7,(char (*) [28])"\', is not defined for the \'",psVar8,
               (char (*) [17])"\' link language.");
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)&items);
    cmake::IssueMessage(pcVar2,FATAL_ERROR,(string *)(local_268 + 0x10),
                        (cmListFileBacktrace *)&items);
  }
  else {
    memset((element_type *)local_1f0,0,0x98);
    local_200._8_8_ = (cmMakefile *)0x0;
    local_1f0[0x10] = '\0';
    local_1f0._24_8_ = local_1f0 + 0x28;
    local_1f0[0x28] = '\0';
    local_1f0._56_8_ = &local_1a8;
    local_1a8._0_1_ = 0;
    local_1a8._16_8_ = &local_188;
    local_188._M_local_buf[0] = false;
    local_178._M_allocated_capacity = (size_type)&local_168;
    local_168._M_local_buf[0] = '\0';
    local_200._0_8_ = (element_type *)local_1f0;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
    ::_M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                *)local_208._M_p,feature,(FeatureDescriptor *)local_200);
    FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)local_200);
    pcVar2 = this->CMakeInstance;
    local_200._0_8_ = &DAT_00000009;
    local_200._8_8_ = "Feature \'";
    local_238[0]._8_8_ = (feature->_M_dataplus)._M_p;
    local_238[0]._0_8_ = feature->_M_string_length;
    psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    cmStrCat<char[77],std::__cxx11::string,char[30],std::__cxx11::string,char[17]>
              ((string *)(local_268 + 0x10),(cmAlphaNum *)local_200,(cmAlphaNum *)local_238,
               (char (*) [77])
               "\', specified through generator-expression \'$<LINK_LIBRARY>\' to link target \'",
               psVar7,(char (*) [30])"\', is not supported for the \'",psVar8,
               (char (*) [17])"\' link language.");
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)&items);
    cmake::IssueMessage(pcVar2,FATAL_ERROR,(string *)(local_268 + 0x10),
                        (cmListFileBacktrace *)&items);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &items.
              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::string::~string((string *)(local_268 + 0x10));
  bVar4 = false;
LAB_002e4d97:
  std::__cxx11::string::~string((string *)&featureName);
  return bVar4;
}

Assistant:

bool cmComputeLinkInformation::AddLibraryFeature(std::string const& feature)
{
  auto it = this->LibraryFeatureDescriptors.find(feature);
  if (it != this->LibraryFeatureDescriptors.end()) {
    return it->second.Supported;
  }

  auto featureName =
    cmStrCat("CMAKE_", this->LinkLanguage, "_LINK_LIBRARY_USING_", feature);
  cmValue featureSupported =
    this->Makefile->GetDefinition(cmStrCat(featureName, "_SUPPORTED"));
  if (!featureSupported) {
    // language specific variable is not defined, fallback to the more generic
    // one
    featureName = cmStrCat("CMAKE_LINK_LIBRARY_USING_", feature);
    featureSupported =
      this->Makefile->GetDefinition(cmStrCat(featureName, "_SUPPORTED"));
  }
  if (!featureSupported.IsOn()) {
    this->LibraryFeatureDescriptors.emplace(feature, FeatureDescriptor{});

    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(
        "Feature '", feature,
        "', specified through generator-expression '$<LINK_LIBRARY>' to "
        "link target '",
        this->Target->GetName(), "', is not supported for the '",
        this->LinkLanguage, "' link language."),
      this->Target->GetBacktrace());

    return false;
  }

  cmValue langFeature = this->Makefile->GetDefinition(featureName);
  if (!langFeature) {
    this->LibraryFeatureDescriptors.emplace(feature, FeatureDescriptor{});

    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(
        "Feature '", feature,
        "', specified through generator-expression '$<LINK_LIBRARY>' to "
        "link target '",
        this->Target->GetName(), "', is not defined for the '",
        this->LinkLanguage, "' link language."),
      this->Target->GetBacktrace());

    return false;
  }

  auto items =
    cmExpandListWithBacktrace(langFeature, this->Target->GetBacktrace(), true);

  if ((items.size() == 1 && !IsValidFeatureFormat(items.front().Value)) ||
      (items.size() == 3 && !IsValidFeatureFormat(items[1].Value))) {
    this->LibraryFeatureDescriptors.emplace(feature, FeatureDescriptor{});
    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Feature '", feature, "', specified by variable '", featureName,
               "', is malformed (\"<LIBRARY>\", \"<LIB_ITEM>\", or "
               "\"<LINK_ITEM>\" patterns "
               "are missing) and cannot be used to link target '",
               this->Target->GetName(), "'."),
      this->Target->GetBacktrace());

    return false;
  }

  // now, handle possible "PATH{}" and "NAME{}" patterns
  if (items.size() == 1) {
    items.push_back(items.front());
    FinalizeFeatureFormat(items[0].Value, "PATH{", "NAME{");
    FinalizeFeatureFormat(items[1].Value, "NAME{", "PATH{");
  } else if (items.size() == 3) {
    items.insert(items.begin() + 1, items[1]);
    FinalizeFeatureFormat(items[1].Value, "PATH{", "NAME{");
    FinalizeFeatureFormat(items[2].Value, "NAME{", "PATH{");
  } else {
    this->LibraryFeatureDescriptors.emplace(feature, FeatureDescriptor{});
    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Feature '", feature, "', specified by variable '", featureName,
               "', is malformed (wrong number of elements) and cannot be used "
               "to link target '",
               this->Target->GetName(), "'."),
      this->Target->GetBacktrace());

    return false;
  }
  if ((items.size() == 2 && !IsValidFeatureFormat(items[0].Value)) ||
      (items.size() == 4 && !IsValidFeatureFormat(items[1].Value))) {
    // PATH{} has wrong format
    this->LibraryFeatureDescriptors.emplace(feature, FeatureDescriptor{});
    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Feature '", feature, "', specified by variable '", featureName,
               "', is malformed (\"<LIBRARY>\", \"<LIB_ITEM>\", or "
               "\"<LINK_ITEM>\" patterns "
               "are missing for \"PATH{}\" alternative) and cannot be used to "
               "link target '",
               this->Target->GetName(), "'."),
      this->Target->GetBacktrace());

    return false;
  }
  if ((items.size() == 2 && !IsValidFeatureFormat(items[1].Value)) ||
      (items.size() == 4 && !IsValidFeatureFormat(items[2].Value))) {
    // NAME{} has wrong format
    this->LibraryFeatureDescriptors.emplace(feature, FeatureDescriptor{});
    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Feature '", feature, "', specified by variable '", featureName,
               "', is malformed (\"<LIBRARY>\", \"<LIB_ITEM>\", or "
               "\"<LINK_ITEM>\" patterns "
               "are missing for \"NAME{}\" alternative) and cannot be used to "
               "link target '",
               this->Target->GetName(), "'."),
      this->Target->GetBacktrace());

    return false;
  }

  // replace LINKER: pattern
  this->Target->ResolveLinkerWrapper(items, this->LinkLanguage, true);

  if (items.size() == 2) {
    this->LibraryFeatureDescriptors.emplace(
      feature,
      LibraryFeatureDescriptor{ feature, items[0].Value, items[1].Value });
  } else {
    this->LibraryFeatureDescriptors.emplace(
      feature,
      LibraryFeatureDescriptor{ feature, items[0].Value, items[1].Value,
                                items[2].Value, items[3].Value });
  }

  return true;
}